

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[21]>
          (Exception *this,char **args,char *args_1,int *args_2,char *args_3,int *args_4,
          char *args_5,char (*args_6) [21])

{
  string *in_RDI;
  char *in_stack_00000010;
  ostringstream oss;
  ostringstream *this_00;
  char **in_stack_fffffffffffffe20;
  ostringstream *in_stack_fffffffffffffe28;
  Exception *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  char (*in_stack_fffffffffffffe50) [21];
  
  this_00 = (ostringstream *)&stack0xfffffffffffffe50;
  std::__cxx11::ostringstream::ostringstream(this_00);
  SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[21]>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             (char *)this_00,(int *)in_RDI,in_stack_00000010,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=(in_RDI,(string *)&stack0xfffffffffffffe20);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe50);
  return;
}

Assistant:

void SetWhat(Args&&... args)
        {
            std::ostringstream oss;
            SetWhat(oss, std::forward<Args>(args)...);
            what_ = oss.str();
        }